

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

String * __thiscall Path::name(String *__return_storage_ptr__,Path *this)

{
  size_type sVar1;
  long lVar2;
  pointer pcVar3;
  
  pcVar3 = (this->super_String).mString._M_dataplus._M_p;
  sVar1 = (this->super_String).mString._M_string_length;
  if (sVar1 != 0) {
    if (pcVar3[sVar1 - 1] == '/') {
      lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
      if (lVar2 != -1) {
        String::mid(__return_storage_ptr__,&this->super_String,lVar2 + 1,
                    ((this->super_String).mString._M_string_length - lVar2) - 2);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->mString)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mString).field_2;
      (__return_storage_ptr__->mString)._M_string_length = 0;
      (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    if (1 < (int)sVar1) {
      lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
      lVar2 = lVar2 + 1;
      pcVar3 = (this->super_String).mString._M_dataplus._M_p;
      goto LAB_001508a7;
    }
  }
  lVar2 = 0;
LAB_001508a7:
  String::String(__return_storage_ptr__,pcVar3 + lVar2,0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

String Path::name() const
{
    if (endsWith('/')) {
        const size_t secondLastSlash = lastIndexOf('/', size() - 2);
        if (secondLastSlash != String::npos) {
            return mid(secondLastSlash + 1, size() - secondLastSlash - 2);
        }
        return String();
    } else {
        return fileName();
    }
}